

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

void Saig_BmcAddTargetsAsPos(Saig_Bmc_t *p)

{
  int iVar1;
  Aig_Obj_t *pDriver;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Saig_Bmc_t *p_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vTargets), local_1c < iVar1; local_1c = local_1c + 1) {
    pDriver = (Aig_Obj_t *)Vec_PtrEntry(p->vTargets,local_1c);
    Aig_ObjCreateCo(p->pFrm,pDriver);
  }
  Aig_ManPrintStats(p->pFrm);
  Aig_ManCleanup(p->pFrm);
  Aig_ManPrintStats(p->pFrm);
  return;
}

Assistant:

void Saig_BmcAddTargetsAsPos( Saig_Bmc_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vTargets, pObj, i )
        Aig_ObjCreateCo( p->pFrm, pObj );
    Aig_ManPrintStats( p->pFrm );
    Aig_ManCleanup( p->pFrm );
    Aig_ManPrintStats( p->pFrm );
}